

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O2

Status * __thiscall
draco::PlyReader::Read(Status *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  bool bVar1;
  PlyReader *this_00;
  string format;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string value;
  string version;
  allocator<char> local_b9;
  string local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  bVar1 = parser::ParseString(buffer,&local_60);
  if (bVar1) {
    bVar1 = std::operator!=(&local_60,"ply");
    if (!bVar1) {
      parser::SkipLine(buffer);
      this_00 = (PlyReader *)&local_60;
      parser::ParseLine(buffer,(string *)this_00);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      local_98._M_string_length = 0;
      local_98.field_2._M_local_buf[0] = '\0';
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      local_40._M_string_length = 0;
      local_40.field_2._M_local_buf[0] = '\0';
      SplitWords(&local_78,this_00,&local_60);
      if ((ulong)((long)local_78.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_78.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x41) {
LAB_00115ce5:
        std::__cxx11::string::string<std::allocator<char>>
                  (local_b8,"Missing or wrong format line",&local_b9);
        __return_storage_ptr__->code_ = INVALID_PARAMETER;
        std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_b8);
LAB_00115d0f:
        std::__cxx11::string::~string(local_b8);
      }
      else {
        bVar1 = std::operator==(local_78.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,"format");
        if (!bVar1) goto LAB_00115ce5;
        std::__cxx11::string::_M_assign((string *)&local_98);
        std::__cxx11::string::_M_assign((string *)&local_40);
        bVar1 = std::operator!=(&local_40,"1.0");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_b8,"Unsupported PLY version",&local_b9);
          __return_storage_ptr__->code_ = UNSUPPORTED_VERSION;
          std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_b8);
          goto LAB_00115d0f;
        }
        bVar1 = std::operator==(&local_98,"binary_big_endian");
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    (local_b8,
                     "Unsupported format. Currently we support only ascii and binary_little_endian format."
                     ,&local_b9);
          __return_storage_ptr__->code_ = UNSUPPORTED_VERSION;
          std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_b8);
          goto LAB_00115d0f;
        }
        bVar1 = std::operator==(&local_98,"ascii");
        this->format_ = (uint)bVar1;
        ParseHeader(__return_storage_ptr__,this,buffer);
        if (__return_storage_ptr__->code_ == OK) {
          std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_msg_);
          bVar1 = ParsePropertiesData(this,buffer);
          if (!bVar1) {
            std::__cxx11::string::string<std::allocator<char>>
                      (local_b8,"Couldn\'t parse properties",&local_b9);
            __return_storage_ptr__->code_ = INVALID_PARAMETER;
            std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,local_b8);
            goto LAB_00115d0f;
          }
          __return_storage_ptr__->code_ = OK;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->error_msg_).field_2;
          (__return_storage_ptr__->error_msg_)._M_string_length = 0;
          (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_78);
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_00115d30;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Not a valid ply file",(allocator<char> *)&local_40);
  __return_storage_ptr__->code_ = INVALID_PARAMETER;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)&local_98);
LAB_00115d30:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

Status PlyReader::Read(DecoderBuffer *buffer) {
  std::string value;
  // The first line needs to by "ply".
  if (!parser::ParseString(buffer, &value) || value != "ply") {
    return Status(Status::INVALID_PARAMETER, "Not a valid ply file");
  }
  parser::SkipLine(buffer);

  // The second line needs to be the format of the ply file.
  parser::ParseLine(buffer, &value);
  std::string format, version;
  const std::vector<std::string> words = SplitWords(value);
  if (words.size() >= 3 && words[0] == "format") {
    format = words[1];
    version = words[2];
  } else {
    return Status(Status::INVALID_PARAMETER, "Missing or wrong format line");
  }
  if (version != "1.0") {
    return Status(Status::UNSUPPORTED_VERSION, "Unsupported PLY version");
  }
  if (format == "binary_big_endian") {
    return Status(Status::UNSUPPORTED_VERSION,
                  "Unsupported format. Currently we support only ascii and"
                  " binary_little_endian format.");
  }
  if (format == "ascii") {
    format_ = kAscii;
  } else {
    format_ = kLittleEndian;
  }
  DRACO_RETURN_IF_ERROR(ParseHeader(buffer));
  if (!ParsePropertiesData(buffer)) {
    return Status(Status::INVALID_PARAMETER, "Couldn't parse properties");
  }
  return OkStatus();
}